

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

TValueCC calcCC<short>(TWaveformViewT<short> *waveform0,TWaveformViewT<short> *waveform1,
                      int64_t sum0,int64_t sum02)

{
  short sVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  
  lVar2 = waveform0->n;
  if (waveform1->n < waveform0->n) {
    lVar2 = waveform1->n;
  }
  lVar6 = 0;
  lVar7 = 0;
  if (0 < lVar2) {
    lVar7 = lVar2;
  }
  lVar5 = 0;
  lVar3 = 0;
  lVar4 = 0;
  for (; lVar7 != lVar6; lVar6 = lVar6 + 1) {
    sVar1 = waveform1->samples[lVar6];
    lVar4 = lVar4 + sVar1;
    lVar3 = lVar3 + (ulong)(uint)((int)sVar1 * (int)sVar1);
    lVar5 = lVar5 + (long)waveform0->samples[lVar6] * (long)sVar1;
  }
  dVar8 = (double)(lVar3 * lVar2 - lVar4 * lVar4) * (double)(sum02 * lVar2 - sum0 * sum0);
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  return (double)(lVar5 * lVar2 - lVar4 * sum0) / dVar8;
}

Assistant:

TValueCC calcCC(
    const TWaveformViewT<T> & waveform0,
    const TWaveformViewT<T> & waveform1,
    int64_t sum0, int64_t sum02) {
    TValueCC cc = -1.0f;

    int64_t sum1 = 0;
    int64_t sum12 = 0;
    int64_t sum01 = 0;

    auto samples0 = waveform0.samples;
    auto n0       = waveform0.n;

    auto samples1 = waveform1.samples;
    auto n1       = waveform1.n;

#ifdef MY_DEBUG
    if (n0 != n1) {
        printf("BUG 234f8273\n");
    }
#endif
    auto n = std::min(n0, n1);

    for (int64_t is = 0; is < n; ++is) {
        int32_t a0 = samples0[is];
        int32_t a1 = samples1[is];

        sum1 += a1;
        sum12 += a1*a1;
        sum01 += a0*a1;
    }

    {
        double nom = sum01*n - sum0*sum1;
        double den2a = sum02*n - sum0*sum0;
        double den2b = sum12*n - sum1*sum1;
        cc = (nom)/(sqrt(den2a*den2b));
    }

    return cc;
}